

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatinbuilder.cpp
# Opt level: O0

void __thiscall
icu_63::CollationFastLatinBuilder::getCEs
          (CollationFastLatinBuilder *this,CollationData *data,UErrorCode *errorCode)

{
  UBool UVar1;
  uint32_t local_34;
  CollationData *pCStack_30;
  uint32_t ce32;
  CollationData *d;
  UChar c;
  int32_t i;
  UErrorCode *errorCode_local;
  CollationData *data_local;
  CollationFastLatinBuilder *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 != '\0') {
    return;
  }
  d._4_4_ = 0;
  d._2_2_ = 0;
  do {
    if (d._2_2_ == 0x180) {
      d._2_2_ = 0x2000;
    }
    else if (d._2_2_ == 0x2040) {
      UVector64::addElement(&this->contractionCEs,0x1ff,errorCode);
      return;
    }
    local_34 = CollationData::getCE32(data,(uint)d._2_2_);
    pCStack_30 = data;
    if (local_34 == 0xc0) {
      pCStack_30 = data->base;
      local_34 = CollationData::getCE32(pCStack_30,(uint)d._2_2_);
    }
    UVar1 = getCEsFromCE32(this,pCStack_30,(uint)d._2_2_,local_34,errorCode);
    if (UVar1 == '\0') {
      this->ce0 = 0x101000100;
      this->charCEs[d._4_4_][0] = 0x101000100;
      this->ce1 = 0;
      this->charCEs[d._4_4_][1] = 0;
    }
    else {
      this->charCEs[d._4_4_][0] = this->ce0;
      this->charCEs[d._4_4_][1] = this->ce1;
      addUniqueCE(this,this->ce0,errorCode);
      addUniqueCE(this,this->ce1,errorCode);
    }
    if ((d._2_2_ == 0) && (UVar1 = isContractionCharCE(this->ce0), UVar1 == '\0')) {
      addContractionEntry(this,0x1ff,this->ce0,this->ce1,errorCode);
      this->charCEs[0][0] = 0x180000000;
      this->charCEs[0][1] = 0;
    }
    d._4_4_ = d._4_4_ + 1;
    d._2_2_ = d._2_2_ + 1;
  } while( true );
}

Assistant:

void
CollationFastLatinBuilder::getCEs(const CollationData &data, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return; }
    int32_t i = 0;
    for(UChar c = 0;; ++i, ++c) {
        if(c == CollationFastLatin::LATIN_LIMIT) {
            c = CollationFastLatin::PUNCT_START;
        } else if(c == CollationFastLatin::PUNCT_LIMIT) {
            break;
        }
        const CollationData *d;
        uint32_t ce32 = data.getCE32(c);
        if(ce32 == Collation::FALLBACK_CE32) {
            d = data.base;
            ce32 = d->getCE32(c);
        } else {
            d = &data;
        }
        if(getCEsFromCE32(*d, c, ce32, errorCode)) {
            charCEs[i][0] = ce0;
            charCEs[i][1] = ce1;
            addUniqueCE(ce0, errorCode);
            addUniqueCE(ce1, errorCode);
        } else {
            // bail out for c
            charCEs[i][0] = ce0 = Collation::NO_CE;
            charCEs[i][1] = ce1 = 0;
        }
        if(c == 0 && !isContractionCharCE(ce0)) {
            // Always map U+0000 to a contraction.
            // Write a contraction list with only a default value if there is no real contraction.
            U_ASSERT(contractionCEs.isEmpty());
            addContractionEntry(CollationFastLatin::CONTR_CHAR_MASK, ce0, ce1, errorCode);
            charCEs[0][0] = ((int64_t)Collation::NO_CE_PRIMARY << 32) | CONTRACTION_FLAG;
            charCEs[0][1] = 0;
        }
    }
    // Terminate the last contraction list.
    contractionCEs.addElement(CollationFastLatin::CONTR_CHAR_MASK, errorCode);
}